

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void rapidjson::SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
               (GenericInsituStringStream<rapidjson::UTF8<char>_> *is)

{
  Ch CVar1;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_RDI;
  bool bVar2;
  Ch c;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *s;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> copy;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> local_28;
  
  internal::StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>::
  StreamLocalCopy(&local_28,in_RDI);
  while( true ) {
    CVar1 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(&local_28.s);
    bVar2 = true;
    if (((CVar1 != ' ') && (bVar2 = true, CVar1 != '\n')) && (bVar2 = true, CVar1 != '\r')) {
      bVar2 = CVar1 == '\t';
    }
    if (!bVar2) break;
    GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(&local_28.s);
  }
  internal::StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>::
  ~StreamLocalCopy(&local_28);
  return;
}

Assistant:

void SkipWhitespace(InputStream& is) {
    internal::StreamLocalCopy<InputStream> copy(is);
    InputStream& s(copy.s);

    typename InputStream::Ch c;
    while ((c = s.Peek()) == ' ' || c == '\n' || c == '\r' || c == '\t')
        s.Take();
}